

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDenseNetwork.cpp
# Opt level: O0

vector<float,_std::allocator<float>_> * __thiscall
IDenseNetwork::Forward
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,IDenseNetwork *this,
          SpikeTrain *sample,float simulationTime,bool useStdp)

{
  IEventManager *pIVar1;
  SpikeTrain *pSVar2;
  reference ppIVar3;
  IDenseNetwork *this_00;
  size_t __n;
  size_type sVar4;
  INeuron *pIVar5;
  reference pvVar6;
  vector<ILayer_*,_std::allocator<ILayer_*>_> *this_01;
  value_type extraout_XMM0_Da;
  ulong local_50;
  size_t idx;
  allocator<float> local_32;
  undefined1 local_31;
  value_type local_30;
  ILayer *output;
  bool useStdp_local;
  SpikeTrain *pSStack_20;
  float simulationTime_local;
  SpikeTrain *sample_local;
  IDenseNetwork *this_local;
  vector<float,_std::allocator<float>_> *result;
  
  this_01 = &this->layers;
  output._3_1_ = useStdp;
  output._4_4_ = simulationTime;
  pSStack_20 = sample;
  sample_local = (SpikeTrain *)this;
  this_local = (IDenseNetwork *)__return_storage_ptr__;
  ppIVar3 = std::vector<ILayer_*,_std::allocator<ILayer_*>_>::back(this_01);
  pSVar2 = pSStack_20;
  local_30 = *ppIVar3;
  pIVar1 = this->eventManager;
  ppIVar3 = std::vector<ILayer_*,_std::allocator<ILayer_*>_>::front(this_01);
  (**(code **)(*(long *)pIVar1 + 0x20))(pIVar1,pSVar2,*ppIVar3);
  (**(code **)(*(long *)this->eventManager + 0x10))
            (output._4_4_,this->eventManager,output._3_1_ & 1);
  this_00 = Relax(this,output._4_4_);
  LogBasicStats(this_00);
  local_31 = 0;
  ppIVar3 = std::vector<ILayer_*,_std::allocator<ILayer_*>_>::back(this_01);
  __n = ILayer::GetSize(*ppIVar3);
  std::allocator<float>::allocator(&local_32);
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__,__n,&local_32);
  std::allocator<float>::~allocator(&local_32);
  for (local_50 = 0;
      sVar4 = std::vector<float,_std::allocator<float>_>::size(__return_storage_ptr__),
      local_50 < sVar4; local_50 = local_50 + 1) {
    pIVar5 = ILayer::operator[](local_30,local_50);
    (*pIVar5->_vptr_INeuron[4])();
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](__return_storage_ptr__,local_50)
    ;
    *pvVar6 = extraout_XMM0_Da;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> IDenseNetwork::Forward( const SPIKING_NN::SpikeTrain &sample, float simulationTime, bool useStdp )
{
    ILayer &output = *layers.back();
    eventManager.RegisterSpikeTrain( sample, *layers.front());
    eventManager.RunSimulation( simulationTime, useStdp );
    Relax( simulationTime ).LogBasicStats();

    auto result = std::vector<float>( layers.back()->GetSize());
    for ( size_t idx = 0; idx < result.size(); ++idx ) {
        result[idx] = output[idx]->GetOutput();
    }
    return result;
}